

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<QStyle::SubControl,_QRect>_>::Data
          (Data<QHashPrivate::Node<QStyle::SubControl,_QRect>_> *this,
          Data<QHashPrivate::Node<QStyle::SubControl,_QRect>_> *other,size_t reserved)

{
  Entry *key;
  ulong uVar1;
  Span *pSVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  Node<QStyle::SubControl,_QRect> *pNVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  size_t numBuckets;
  R RVar10;
  Bucket BVar11;
  
  (this->ref).atomic._q_value.super___atomic_base<int>._M_i = 1;
  uVar1 = other->size;
  this->size = uVar1;
  this->numBuckets = 0;
  if (reserved < uVar1) {
    reserved = uVar1;
  }
  this->seed = other->seed;
  this->spans = (Span *)0x0;
  numBuckets = 0x80;
  if ((0x40 < reserved) && (numBuckets = 0xffffffffffffffff, reserved >> 0x3e == 0)) {
    lVar6 = 0x3f;
    if (reserved != 0) {
      for (; reserved >> lVar6 == 0; lVar6 = lVar6 + -1) {
      }
    }
    numBuckets = 1L << (0x41 - ((byte)lVar6 ^ 0x3f) & 0x3f);
  }
  this->numBuckets = numBuckets;
  RVar10 = allocateSpans(numBuckets);
  this->spans = (Span *)RVar10.spans;
  uVar1 = other->numBuckets;
  if (0x7f < uVar1) {
    lVar6 = 0;
    uVar8 = 0;
    do {
      pSVar2 = other->spans;
      lVar9 = 0;
      do {
        uVar7 = (ulong)pSVar2->offsets[lVar9 + lVar6];
        if (uVar7 != 0xff) {
          key = pSVar2[uVar8].entries + uVar7;
          uVar7 = (this->seed >> 0x20 ^ this->seed ^ (ulong)*(uint *)(key->storage).data) *
                  -0x2917014799a6026d;
          uVar7 = (uVar7 >> 0x20 ^ uVar7) * -0x2917014799a6026d;
          BVar11 = findBucketWithHash<QStyle::SubControl>
                             (this,(SubControl *)key,uVar7 >> 0x20 ^ uVar7);
          pNVar5 = Span<QHashPrivate::Node<QStyle::SubControl,_QRect>_>::insert
                             (BVar11.span,BVar11.index);
          uVar3 = *(undefined8 *)(key->storage).data;
          uVar4 = *(undefined8 *)((key->storage).data + 8);
          pNVar5->key = (int)uVar3;
          (pNVar5->value).x1 = (Representation)(int)((ulong)uVar3 >> 0x20);
          (pNVar5->value).y1 = (Representation)(int)uVar4;
          (pNVar5->value).x2 = (Representation)(int)((ulong)uVar4 >> 0x20);
          (pNVar5->value).y2.m_i = *(int *)((key->storage).data + 0x10);
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0x80);
      uVar8 = uVar8 + 1;
      lVar6 = lVar6 + 0x90;
    } while (uVar8 != uVar1 >> 7);
  }
  return;
}

Assistant:

Data(const Data &other, size_t reserved) : size(other.size), seed(other.seed)
    {
        numBuckets = GrowthPolicy::bucketsForCapacity(qMax(size, reserved));
        spans = allocateSpans(numBuckets).spans;
        size_t otherNSpans = other.numBuckets >> SpanConstants::SpanShift;
        reallocationHelper<true>(other, otherNSpans);
    }